

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueFloat64::write(PLYValueFloat64 *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  char cVar2;
  
  cVar2 = (char)__fd;
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  sVar1 = std::streambuf::sputc(cVar2);
  return sVar1;
}

Assistant:

void write(std::streambuf *out, double v)
    {
      char *p=reinterpret_cast<char *>(&v);
      out->sputc(p[0]);
      out->sputc(p[1]);
      out->sputc(p[2]);
      out->sputc(p[3]);
      out->sputc(p[4]);
      out->sputc(p[5]);
      out->sputc(p[6]);
      out->sputc(p[7]);
    }